

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType type;
  SQObjectPtr *pSVar2;
  SQObjectPtr local_18;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  type = (pSVar2->super_SQObject)._type;
  if ((type >> 0x1b & 1) == 0) {
    local_18.super_SQObject._type = (pSVar2->super_SQObject)._type;
    local_18.super_SQObject._flags = (pSVar2->super_SQObject)._flags;
    local_18.super_SQObject._5_3_ = *(undefined3 *)&(pSVar2->super_SQObject).field_0x5;
    local_18.super_SQObject._unVal = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pTable;
    if ((local_18.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_18);
  }
  else {
    local_18.super_SQObject._unVal.pWeakRef =
         SQRefCounted::GetWeakRef
                   ((pSVar2->super_SQObject)._unVal.pRefCounted,v->_sharedstate->_alloc_ctx,type,
                    (pSVar2->super_SQObject)._flags);
    local_18.super_SQObject._0_5_ = 0x8010000;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(sq_type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(_ss(v)->_alloc_ctx, sq_type(o), o._flags));
        return;
    }
    v->Push(o);
}